

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O3

void QSettings::setPath(Format format,Scope scope,QString *path)

{
  QHash<int,_(anonymous_namespace)::Path> *this;
  unique_lock<QBasicMutex> *this_00;
  long in_FS_OFFSET;
  QString local_98;
  QStringBuilder<const_QString_&,_QChar> local_80;
  Path local_70;
  unique_lock<QBasicMutex> local_50;
  unique_lock<QBasicMutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_40;
  local_40._M_device = &settingsGlobalMutex;
  local_40._M_owns = false;
  local_40._9_7_ = 0xaaaaaaaaaaaaaa;
  std::unique_lock<QBasicMutex>::lock(this_00);
  local_40._M_owns = true;
  this = (QHash<int,_(anonymous_namespace)::Path> *)
         QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_pathHashFunc>_>::
         operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_pathHashFunc>_>
                     *)this_00);
  if ((*(long *)this == 0) || (*(long *)(*(long *)this + 8) == 0)) {
    local_50._M_device = local_40._M_device;
    local_50._M_owns = local_40._M_owns;
    local_40._M_device = (QBasicMutex *)0x0;
    local_40._M_owns = false;
    initDefaultPaths((unique_lock<QBasicMutex> *)&local_70);
    std::unique_lock<QBasicMutex>::operator=(&local_40,(unique_lock<QBasicMutex> *)&local_70);
    std::unique_lock<QBasicMutex>::~unique_lock((unique_lock<QBasicMutex> *)&local_70);
    std::unique_lock<QBasicMutex>::~unique_lock(&local_50);
  }
  local_80.b.ucs = L'/';
  local_80.a = path;
  QStringBuilder<const_QString_&,_QChar>::convertTo<QString>(&local_98,&local_80);
  local_70.path.d.d = local_98.d.d;
  local_70.path.d.ptr = local_98.d.ptr;
  local_70.path.d.size = local_98.d.size;
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_70.userDefined = true;
  QHash<int,_(anonymous_namespace)::Path>::insert
            (this,(int *)(ulong)((uint)(scope == SystemScope) + format * 2),&local_70);
  if (&(local_70.path.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.path.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  std::unique_lock<QBasicMutex>::~unique_lock(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSettings::setPath(Format format, Scope scope, const QString &path)
{
    auto locker = qt_unique_lock(settingsGlobalMutex);
    PathHash *pathHash = pathHashFunc();
    if (pathHash->isEmpty())
        locker = initDefaultPaths(std::move(locker));
    pathHash->insert(pathHashKey(format, scope), Path(path + QDir::separator(), true));
}